

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O0

void ssh1_connection_process_succfail(ssh1_connection_state *s,_Bool success)

{
  outstanding_succfail *ptr;
  outstanding_succfail *prevhead;
  _Bool success_local;
  ssh1_connection_state *s_local;
  
  ptr = s->succfail_head;
  s->succfail_head = s->succfail_head->next;
  if (s->succfail_head == (outstanding_succfail *)0x0) {
    s->succfail_tail = (outstanding_succfail *)0x0;
  }
  (*ptr->handler)(s,success,ptr->ctx);
  safefree(ptr);
  return;
}

Assistant:

static void ssh1_connection_process_succfail(
    struct ssh1_connection_state *s, bool success)
{
    struct outstanding_succfail *prevhead = s->succfail_head;
    s->succfail_head = s->succfail_head->next;
    if (!s->succfail_head)
        s->succfail_tail = NULL;
    prevhead->handler(s, success, prevhead->ctx);
    sfree(prevhead);
}